

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_run(lua_State *L)

{
  int iVar1;
  TValue *pTVar2;
  ptrdiff_t pVar3;
  lua_State *L_00;
  ulong uVar4;
  GCstr *pGVar5;
  lua_State *in_RDI;
  TValue *top;
  TValue *errfunc;
  ptrdiff_t ef;
  undefined8 in_stack_ffffffffffffff68;
  lua_State *in_stack_ffffffffffffff70;
  TValue *L_01;
  
  pVar3 = finderrfunc(in_RDI);
  if (pVar3 != 0) {
    L_00 = (lua_State *)((ulong)(in_RDI->stack).ptr32 + pVar3);
    pTVar2 = in_RDI->top;
    uVar4 = (ulong)(in_RDI->glref).ptr32;
    *(uint *)(uVar4 + 0x254) = *(uint *)(uVar4 + 0x254) & 0xffffffef;
    iVar1._0_1_ = L_00->marked;
    iVar1._1_1_ = L_00->gct;
    iVar1._2_1_ = L_00->dummy_ffid;
    iVar1._3_1_ = L_00->status;
    if ((iVar1 != -9) || (in_RDI->status == '\x05')) {
      L_01 = pTVar2 + -1;
      pGVar5 = lj_err_str(L_00,(ErrMsg)((ulong)pTVar2 >> 0x20));
      (L_01->u32).lo = (uint32_t)pGVar5;
      (L_01->field_2).it = 0xfffffffb;
      lj_err_throw((lua_State *)&L_01->field_2,(int)((ulong)in_RDI >> 0x20));
    }
    in_RDI->status = '\x05';
    *pTVar2 = pTVar2[-1];
    pTVar2[-1].field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)L_00;
    in_RDI->top = pTVar2 + 1;
    lj_vm_call(in_RDI,pTVar2,2);
  }
  lj_err_throw(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
}

Assistant:

LJ_NOINLINE void lj_err_run(lua_State *L)
{
  ptrdiff_t ef = finderrfunc(L);
  if (ef) {
    TValue *errfunc = restorestack(L, ef);
    TValue *top = L->top;
    lj_trace_abort(G(L));
    if (!tvisfunc(errfunc) || L->status == LUA_ERRERR) {
      setstrV(L, top-1, lj_err_str(L, LJ_ERR_ERRERR));
      lj_err_throw(L, LUA_ERRERR);
    }
    L->status = LUA_ERRERR;
    copyTV(L, top, top-1);
    copyTV(L, top-1, errfunc);
    L->top = top+1;
    lj_vm_call(L, top, 1+1);  /* Stack: |errfunc|msg| -> |msg| */
  }
  lj_err_throw(L, LUA_ERRRUN);
}